

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_work(uv__work *w)

{
  int iVar1;
  bool bVar2;
  _func_void_uv__work_ptr_int *p_Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  long lVar9;
  _func_void_uv__work_ptr *__resolved;
  char *pcVar10;
  size_t sVar11;
  ssize_t sVar12;
  ulong uVar13;
  _func_void_uv__work_ptr_int *p_Var14;
  code *process;
  _func_void_uv__work_ptr_int *p_Var15;
  size_t sVar16;
  double dVar17;
  pollfd pfd;
  stat pbuf;
  _func_void_uv__work_ptr_int *local_2098;
  timeval local_2078;
  long local_2068;
  ulong local_2060;
  _func_void_uv__work_ptr_int *local_2058 [4];
  stat64 local_2038 [56];
  
  iVar1 = *(int *)&w[-7].done;
  puVar8 = (uint *)__errno_location();
  do {
    *puVar8 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      if (uv__fs_open_no_cloexec_support == '\0') {
        uVar6 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                       (ulong)*(uint *)(w[-2].wq + 1));
        if (-1 < (int)uVar6) {
          p_Var15 = (_func_void_uv__work_ptr_int *)(ulong)uVar6;
          goto LAB_0054c24d;
        }
        if (*puVar8 != 0x16) break;
        uv__fs_open_no_cloexec_support = '\x01';
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar4 = open64((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),(ulong)*(uint *)(w[-2].wq + 1))
      ;
      if ((-1 < iVar4) && (iVar5 = uv__cloexec_ioctl(iVar4,1), iVar5 != 0)) {
        iVar5 = uv__close(iVar4);
        iVar4 = -1;
        if (iVar5 != 0) {
switchD_0054bb9d_default:
          abort();
        }
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
LAB_0054bea7:
      p_Var15 = (_func_void_uv__work_ptr_int *)(long)iVar4;
      goto LAB_0054c24d;
    case 2:
      uVar6 = close(*(int *)w[-2].wq);
      break;
    case 3:
      process = uv__fs_read;
      goto LAB_0054bdcc;
    case 4:
      process = uv__fs_write;
LAB_0054bdcc:
      p_Var15 = (_func_void_uv__work_ptr_int *)uv__fs_buf_iter((uv_fs_t *)w[-9].wq,process);
      goto LAB_0054c24d;
    case 5:
      local_2058[0] = w[-1].done;
      sVar12 = sendfile64(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(__off64_t *)local_2058,
                          (size_t)w[1].done);
      if ((sVar12 == -1) && (local_2098 = w[-1].done, (long)local_2058[0] <= (long)local_2098)) {
        uVar6 = *puVar8;
        if (((uVar6 < 0x17) && ((0x440020U >> (uVar6 & 0x1f) & 1) != 0)) ||
           (p_Var15 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar6 == 0x58)) {
          *puVar8 = 0;
          p_Var14 = w[1].done;
          if (p_Var14 == (_func_void_uv__work_ptr_int *)0x0) {
            p_Var15 = (_func_void_uv__work_ptr_int *)0x0;
          }
          else {
            iVar4 = *(int *)w[-2].wq;
            iVar5 = *(int *)((long)w[-2].wq + 4);
            bVar2 = true;
            p_Var3 = (_func_void_uv__work_ptr_int *)0x0;
            do {
              while( true ) {
                p_Var15 = p_Var3;
                sVar16 = (long)p_Var14 - (long)p_Var15;
                if (0x1fff < sVar16) {
                  sVar16 = 0x2000;
                }
                do {
                  if (bVar2) {
                    sVar11 = pread64(iVar5,local_2038,sVar16,(__off64_t)local_2098);
                  }
                  else {
                    sVar11 = read(iVar5,local_2038,sVar16);
                  }
                } while ((sVar11 == 0xffffffffffffffff) && (*puVar8 == 4));
                if (sVar11 == 0) goto LAB_0054c4f8;
                if (sVar11 == 0xffffffffffffffff) break;
                if (0 < (long)sVar11) {
                  lVar9 = 0;
                  sVar16 = sVar11;
                  do {
                    while (sVar12 = write(iVar4,(void *)((long)local_2038[0].__unused +
                                                        lVar9 + -0x78),sVar16), sVar12 == -1) {
                      if (*puVar8 != 4) {
                        if (*puVar8 != 0xb) {
                          p_Var15 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                          goto LAB_0054c4f8;
                        }
                        local_2078.tv_sec = CONCAT44(4,iVar4);
                        while (iVar7 = poll((pollfd *)&local_2078,1,-1), iVar7 == -1) {
                          if (*puVar8 != 4) goto LAB_0054c4cf;
                        }
                        if ((local_2078.tv_sec & 0xfffb000000000000U) != 0) {
LAB_0054c4cf:
                          *puVar8 = 5;
                          p_Var15 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                          goto LAB_0054c4f8;
                        }
                      }
                    }
                    lVar9 = lVar9 + sVar12;
                    sVar16 = sVar11 - lVar9;
                  } while (sVar16 != 0 && lVar9 <= (long)sVar11);
                }
                local_2098 = local_2098 + sVar11;
                p_Var15 = p_Var15 + sVar11;
                p_Var3 = p_Var15;
                if (p_Var14 <= p_Var15) goto LAB_0054c4f8;
              }
              if ((!bVar2) || (p_Var15 != (_func_void_uv__work_ptr_int *)0x0)) break;
              bVar2 = false;
              p_Var3 = (_func_void_uv__work_ptr_int *)0x0;
            } while ((*puVar8 == 5) ||
                    (p_Var3 = (_func_void_uv__work_ptr_int *)0x0, *puVar8 == 0x1d));
            p_Var15 = (_func_void_uv__work_ptr_int *)
                      ((ulong)p_Var15 | -(ulong)(p_Var15 == (_func_void_uv__work_ptr_int *)0x0));
          }
LAB_0054c4f8:
          if (p_Var15 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0054bcea;
        }
      }
      else {
        p_Var15 = local_2058[0] + -(long)w[-1].done;
        local_2098 = local_2058[0];
LAB_0054bcea:
        w[-1].done = local_2098;
      }
      goto LAB_0054c24d;
    case 6:
      uVar6 = stat64((char *)w[-6].done,local_2038);
      goto LAB_0054bed3;
    case 7:
      uVar6 = lstat64((char *)w[-6].done,local_2038);
      goto LAB_0054bed3;
    case 8:
      uVar6 = fstat64(*(int *)w[-2].wq,local_2038);
LAB_0054bed3:
      if (uVar6 == 0) {
        w[-6].loop = (uv_loop_s *)local_2038[0].st_dev;
        w[-6].wq[0] = (void *)(local_2038[0]._24_8_ & 0xffffffff);
        w[-6].wq[1] = (void *)local_2038[0].st_nlink;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2038[0]._24_8_ >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2038[0].st_gid;
        w[-5].loop = (uv_loop_s *)local_2038[0].st_rdev;
        w[-5].wq[0] = (void *)local_2038[0].st_ino;
        w[-5].wq[1] = (void *)local_2038[0].st_size;
        w[-4].work = (_func_void_uv__work_ptr *)local_2038[0].st_blksize;
        w[-4].done = (_func_void_uv__work_ptr_int *)local_2038[0].st_blocks;
        w[-4].wq[1] = (void *)local_2038[0].st_atim.tv_sec;
        w[-3].work = (_func_void_uv__work_ptr *)local_2038[0].st_atim.tv_nsec;
        w[-3].done = (_func_void_uv__work_ptr_int *)local_2038[0].st_mtim.tv_sec;
        w[-3].loop = (uv_loop_s *)local_2038[0].st_mtim.tv_nsec;
        w[-3].wq[0] = (void *)local_2038[0].st_ctim.tv_sec;
        w[-3].wq[1] = (void *)local_2038[0].st_ctim.tv_nsec;
        w[-2].work = (_func_void_uv__work_ptr *)local_2038[0].st_ctim.tv_sec;
        w[-2].done = (_func_void_uv__work_ptr_int *)local_2038[0].st_ctim.tv_nsec;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
      }
      break;
    case 9:
      uVar6 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
      break;
    case 10:
      local_2038[0].st_dev = (__dev_t)(double)w[-1].wq[0];
      local_2038[0].st_ino = (__ino64_t)(double)w[-1].wq[1];
      uVar6 = utime((char *)w[-6].done,(utimbuf *)local_2038);
      break;
    case 0xb:
      if (uv__fs_futime_no_utimesat == '\0') {
        local_2038[0].st_dev = (__dev_t)(double)w[-1].wq[0];
        dVar17 = (double)w[-1].wq[0] * 1000000.0;
        uVar13 = (ulong)dVar17;
        local_2038[0].st_ino =
             (((long)(dVar17 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13) % 1000000) *
             1000;
        local_2038[0].st_nlink = (__nlink_t)(double)w[-1].wq[1];
        dVar17 = (double)w[-1].wq[1] * 1000000.0;
        uVar13 = (ulong)dVar17;
        local_2038[0]._24_8_ =
             (((long)(dVar17 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13) % 1000000) *
             1000;
        p_Var15 = (_func_void_uv__work_ptr_int *)0x0;
        iVar4 = uv__utimesat(*(int *)w[-2].wq,(char *)0x0,(timespec *)local_2038,0);
        if (iVar4 != 0) {
          if (*puVar8 == 0x26) {
            uv__fs_futime_no_utimesat = '\x01';
            goto LAB_0054c0d5;
          }
          p_Var15 = (_func_void_uv__work_ptr_int *)(long)iVar4;
        }
      }
      else {
LAB_0054c0d5:
        local_2078.tv_sec = (__time_t)(double)w[-1].wq[0];
        dVar17 = (double)w[-1].wq[0] * 1000000.0;
        uVar13 = (ulong)dVar17;
        local_2078.tv_usec =
             ((long)(dVar17 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13) % 1000000;
        local_2068 = (long)(double)w[-1].wq[1];
        dVar17 = (double)w[-1].wq[1] * 1000000.0;
        uVar13 = (ulong)dVar17;
        local_2060 = ((long)(dVar17 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13) %
                     1000000;
        p_Var15 = (_func_void_uv__work_ptr_int *)0x0;
        snprintf((char *)local_2058,0x1b,"/proc/self/fd/%d",(ulong)*(uint *)w[-2].wq);
        iVar4 = utimes((char *)local_2058,&local_2078);
        if (iVar4 != 0) {
          uVar6 = *puVar8;
          if (((uVar6 == 0x14) || (uVar6 == 0xd)) ||
             ((uVar6 == 2 &&
              ((iVar5 = fcntl64(*(undefined4 *)w[-2].wq,3), iVar5 != -1 || (*puVar8 != 9)))))) {
            *puVar8 = 0x26;
          }
          p_Var15 = (_func_void_uv__work_ptr_int *)(long)iVar4;
        }
      }
      goto LAB_0054c24d;
    case 0xc:
      uVar6 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      uVar6 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      uVar6 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      uVar6 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      uVar6 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      uVar6 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      uVar6 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      uVar6 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar10 = mkdtemp((char *)w[-6].done);
      p_Var15 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar10 == (char *)0x0);
      goto LAB_0054c24d;
    case 0x15:
      uVar6 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      local_2038[0].st_dev = 0;
      iVar4 = scandir64((char *)w[-6].done,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar4 != -1) {
        if (iVar4 == 0) {
          free((void *)local_2038[0].st_dev);
          local_2038[0].st_dev = 0;
        }
        w[-6].work = (_func_void_uv__work_ptr *)local_2038[0].st_dev;
        goto LAB_0054bea7;
      }
      p_Var15 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0054c24d;
    case 0x17:
      uVar6 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      uVar6 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar11 = pathconf((char *)w[-6].done,4);
      sVar16 = 0x1000;
      if (sVar11 != 0xffffffffffffffff) {
        sVar16 = sVar11;
      }
      __resolved = (_func_void_uv__work_ptr *)uv__malloc(sVar16 + 1);
      if (__resolved == (_func_void_uv__work_ptr *)0x0) {
LAB_0054c273:
        *puVar8 = 0xc;
        p_Var15 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      else {
        sVar12 = readlink((char *)w[-6].done,(char *)__resolved,sVar16);
        if (sVar12 == -1) goto LAB_0054c2ad;
        __resolved[sVar12] = (_func_void_uv__work_ptr)0x0;
LAB_0054bda0:
        w[-6].work = __resolved;
        p_Var15 = (_func_void_uv__work_ptr_int *)0x0;
      }
      goto LAB_0054c24d;
    case 0x1a:
      uVar6 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      uVar6 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      lVar9 = pathconf((char *)w[-6].done,4);
      sVar16 = 0x1001;
      if (lVar9 + 1U != 0) {
        sVar16 = lVar9 + 1U;
      }
      __resolved = (_func_void_uv__work_ptr *)uv__malloc(sVar16);
      if (__resolved == (_func_void_uv__work_ptr *)0x0) goto LAB_0054c273;
      pcVar10 = realpath((char *)w[-6].done,(char *)__resolved);
      if (pcVar10 != (char *)0x0) goto LAB_0054bda0;
LAB_0054c2ad:
      uv__free(__resolved);
      p_Var15 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0054c24d;
    default:
      goto switchD_0054bb9d_default;
    }
    p_Var15 = (_func_void_uv__work_ptr_int *)(long)(int)uVar6;
LAB_0054c24d:
    p_Var14 = p_Var15;
    if (p_Var15 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0054c520;
  } while (((long)(int)*puVar8 == 4) && (iVar1 != 2));
  p_Var14 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar8;
LAB_0054c520:
  w[-7].wq[1] = p_Var14;
  if ((p_Var15 == (_func_void_uv__work_ptr_int *)0x0) && (*(int *)&w[-7].done - 6U < 3)) {
    w[-6].work = (_func_void_uv__work_ptr *)&w[-6].loop;
  }
  return;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, close(req->file));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_buf_iter(req, uv__fs_read));
    X(SCANDIR, uv__fs_scandir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_buf_iter(req, uv__fs_write));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = -errno;
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}